

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pig.cpp
# Opt level: O0

Pig * __thiscall Pig::peek_abi_cxx11_(Pig *this,int quantity)

{
  long lVar1;
  unsigned_long *puVar2;
  element_type *peVar3;
  char *pcVar4;
  int in_EDX;
  undefined4 in_register_00000034;
  __shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *this_00;
  allocator local_39;
  unsigned_long local_38;
  unsigned_long local_30;
  unsigned_long local_28;
  size_type adjusted;
  __shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *p_Stack_18;
  int quantity_local;
  Pig *this_local;
  
  this_00 = (__shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             *)CONCAT44(in_register_00000034,quantity);
  local_30 = (unsigned_long)in_EDX;
  p_Stack_18 = this_00;
  this_local = this;
  std::
  __shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->(this_00);
  lVar1 = std::__cxx11::string::length();
  local_38 = lVar1 - *(long *)(this_00 + 0x10);
  puVar2 = std::min<unsigned_long>(&local_30,&local_38);
  local_28 = *puVar2;
  peVar3 = std::
           __shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*(this_00);
  pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)peVar3);
  if (*pcVar4 == '\0') {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"",&local_39);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  else {
    peVar3 = std::
             __shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(this_00);
    std::__cxx11::string::substr((ulong)this,(ulong)peVar3);
  }
  return this;
}

Assistant:

std::string Pig::peek (const int quantity) const
{
  std::string::size_type adjusted = std::min (static_cast <std::string::size_type> (quantity), _text->length () - _cursor);
  if ((*_text)[_cursor])
    return _text->substr (_cursor, adjusted);

  return "";
}